

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int pager_shared_lock(Pager *pPager)

{
  unqlite_file **ppOut;
  byte *pbVar1;
  unqlite_file *puVar2;
  _func_int_unqlite_file_ptr *p_Var3;
  _func_int_unqlite_kv_engine_ptr_pgno *p_Var4;
  uint3 uVar5;
  char *pcVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  sxi32 sVar10;
  int iVar11;
  uchar *puVar13;
  pgno pVar14;
  unqlite_kv_methods *pMethods;
  uint uVar15;
  uchar *puVar16;
  uint uVar17;
  char *pcVar18;
  pgno pVar19;
  char *pcVar20;
  unqlite *pDb;
  uchar zRaw [512];
  ulong local_230;
  undefined1 local_228 [7];
  uint local_221;
  byte local_21d;
  byte local_21c;
  byte local_21b;
  byte local_21a;
  undefined1 local_219;
  undefined1 local_218;
  ushort local_217;
  uint local_215;
  ushort local_211;
  undefined1 local_20f [495];
  sxu32 sVar12;
  
  if (pPager->iState != 0) {
    return 0;
  }
  ppOut = &pPager->pfd;
  iVar8 = unqliteOsOpen(pPager->pVfs,pPager->pAllocator,pPager->zFilename,ppOut,pPager->iOpenFlags);
  if (iVar8 != 0) {
    unqliteGenErrorFormat
              (pPager->pDb,"IO error while opening the target database file: %s",pPager->zFilename);
    return iVar8;
  }
  iVar8 = pager_wait_on_lock(pPager,1);
  if (iVar8 == -0xe) {
    unqliteGenError(pPager->pDb,
                    "Another process or thread have a reserved or exclusive lock on this database");
    return -0xe;
  }
  if (iVar8 != 0) {
    return iVar8;
  }
  if ((pPager->iLock < 2) && (iVar8 = pager_journal_rollback(pPager,1), iVar8 != 0)) {
    return iVar8;
  }
  local_230 = 0;
  iVar8 = (*(*ppOut)->pMethods->xFileSize)(*ppOut,(unqlite_int64 *)&local_230);
  if (iVar8 != 0) {
    return iVar8;
  }
  pPager->dbByteSize = local_230;
  if ((long)local_230 < 1) {
    puVar2 = *ppOut;
    uVar15 = 0x200;
    if ((puVar2 != (unqlite_file *)0x0) &&
       (p_Var3 = puVar2->pMethods->xSectorSize, p_Var3 != (_func_int_unqlite_file_ptr *)0x0)) {
      uVar9 = (*p_Var3)(puVar2);
      uVar17 = 0x10000;
      if (uVar9 < 0x10000) {
        uVar17 = uVar9;
      }
      uVar15 = 0x200;
      if (0x1f < (int)uVar9) {
        uVar15 = uVar17;
      }
    }
    pPager->iSectorSize = uVar15;
    sVar12 = 0x1000;
    if (0xffff01fe < sUnqlMPGlobal.iPageSize - 0x10001U) {
      sVar12 = sUnqlMPGlobal.iPageSize;
    }
    pPager->iPageSize = sVar12;
    pcVar20 = pPager->pEngine->pIo->pMethods->zName;
    (pPager->sKv).zString = pcVar20;
    pcVar18 = pcVar20;
    if (*pcVar20 != '\0') {
      pcVar6 = pcVar20 + 2;
      do {
        pcVar18 = pcVar6;
        if (pcVar18[-1] == '\0') {
          pcVar18 = pcVar18 + -1;
          goto LAB_001164fc;
        }
        if (*pcVar18 == '\0') goto LAB_001164fc;
        if (pcVar18[1] == '\0') {
          pcVar18 = pcVar18 + 1;
          goto LAB_001164fc;
        }
        pcVar6 = pcVar18 + 4;
      } while (pcVar18[2] != '\0');
      pcVar18 = pcVar18 + 2;
    }
LAB_001164fc:
    (pPager->sKv).nByte = (int)pcVar18 - (int)pcVar20;
    pPager->dbSize = 0;
LAB_0011650c:
    puVar13 = (uchar *)SyMemBackendAlloc(pPager->pAllocator,sVar12);
    pPager->zTmpPage = puVar13;
    if (puVar13 == (uchar *)0x0) {
      unqliteGenError(pPager->pDb,"unQLite is running out of memory");
      iVar8 = -1;
    }
    else {
      if ((ulong)(uint)pPager->iPageSize != 0) {
        puVar16 = puVar13 + (uint)pPager->iPageSize;
        do {
          *puVar13 = '\0';
          if (puVar16 <= puVar13 + 1) break;
          puVar13[1] = '\0';
          if (puVar16 <= puVar13 + 2) break;
          puVar13[2] = '\0';
          if (puVar16 <= puVar13 + 3) break;
          puVar13[3] = '\0';
          puVar13 = puVar13 + 4;
        } while (puVar13 < puVar16);
      }
      if (((pPager->dbSize != 0) && ((pPager->iOpenFlags & 0x100) != 0)) &&
         (iVar8 = UnixVfs_Mmap(pPager->zFilename,&pPager->pMmap,&pPager->dbByteSize), iVar8 != 0)) {
        unqliteGenError(pPager->pDb,"Cannot obtain a read-only memory view of the target database");
        pbVar1 = (byte *)((long)&pPager->iOpenFlags + 1);
        *pbVar1 = *pbVar1 & 0xfe;
      }
      pPager->iState = 1;
      p_Var4 = pPager->pEngine->pIo->pMethods->xOpen;
      iVar8 = 0;
      if ((p_Var4 != (_func_int_unqlite_kv_engine_ptr_pgno *)0x0) &&
         (iVar11 = (*p_Var4)(pPager->pEngine,pPager->dbSize), iVar11 != 0)) {
        unqliteGenErrorFormat
                  (pPager->pDb,"xOpen() method of the underlying KV engine \'%z\' failed",
                   &pPager->sKv);
        if (pPager->iLock != 0) {
          (*pPager->pfd->pMethods->xUnlock)(pPager->pfd,0);
          pPager->iLock = 0;
        }
        pPager->iState = 0;
        iVar8 = iVar11;
      }
    }
  }
  else {
    if (local_230 < 0x200) {
      unqliteGenError(pPager->pDb,"Malformed database image");
      return -0x18;
    }
    iVar8 = (*(*ppOut)->pMethods->xRead)(*ppOut,local_228,0x200,0);
    if (iVar8 == 0) {
      sVar10 = SyMemcmp("unqlite",local_228,7);
      pcVar20 = "Malformed database image";
      iVar8 = -0x18;
      if ((sVar10 == 0) &&
         ((local_221 >> 0x18 | (local_221 & 0xff0000) >> 8 | (local_221 & 0xff00) << 8 |
          local_221 << 0x18) == 0xdb7c2712)) {
        (pPager->tmCreate).tm_isdst = 0;
        (pPager->tmCreate).tm_year = (local_21d >> 1) + 0x7bc;
        (pPager->tmCreate).tm_mon =
             ((uint)local_21d << 0x18 | (uint)local_21c << 0x10) >> 0x15 & 0xf;
        (pPager->tmCreate).tm_mday = local_21c & 0x1f;
        (pPager->tmCreate).tm_hour = (uint)(local_21b >> 3);
        (pPager->tmCreate).tm_min = (ushort)(CONCAT11(local_21b,local_21a) >> 5) & 0x3f;
        (pPager->tmCreate).tm_sec = (uint)local_21a + (uint)local_21a & 0x3e;
        uVar5 = CONCAT12(local_218,local_217 << 8 | local_217 >> 8);
        uVar15 = CONCAT13(local_219,uVar5);
        pPager->iSectorSize = uVar15;
        uVar17 = local_215 >> 0x18 | (local_215 & 0xff0000) >> 8 | (local_215 & 0xff00) << 8 |
                 local_215 << 0x18;
        pPager->iPageSize = uVar17;
        if ((0x1ff < (int)uVar17) &&
           (((0xffff001e < uVar15 - 0x10001 && (uVar17 < 0x10001)) &&
            ((uVar5 + 0x1ffff & uVar15) == 0)))) {
          uVar7 = local_211 << 8 | local_211 >> 8;
          sVar12 = (sxu32)uVar7;
          if (0x1e6 < uVar7) {
            sVar12 = 0x1e7;
          }
          pcVar20 = (char *)SyMemBackendDup(pPager->pAllocator,local_20f,sVar12);
          if (pcVar20 != (char *)0x0) {
            (pPager->sKv).zString = pcVar20;
            (pPager->sKv).nByte = sVar12;
            pVar14 = (long)local_230 / (long)pPager->iPageSize;
            pVar19 = 1;
            if (pVar14 != 0) {
              pVar19 = pVar14;
            }
            if ((long)local_230 < 1) {
              pVar19 = pVar14;
            }
            pPager->dbSize = pVar19;
            pMethods = unqliteFindKVStore(pcVar20,sVar12);
            if (pMethods == (unqlite_kv_methods *)0x0) {
              unqliteGenErrorFormat
                        (pPager->pDb,"No such Key/Value storage engine \'%z\'",&pPager->sKv);
              return -0x11;
            }
            iVar8 = unqlitePagerRegisterKvEngine(pPager,pMethods);
            if (iVar8 != 0) {
              return iVar8;
            }
            sVar12 = pPager->iPageSize;
            goto LAB_0011650c;
          }
          pcVar20 = "Unqlite is running out of memory";
          iVar8 = -1;
        }
      }
      pDb = pPager->pDb;
    }
    else {
      pDb = pPager->pDb;
      pcVar20 = "IO error while reading database header";
    }
    unqliteGenError(pDb,pcVar20);
  }
  return iVar8;
}

Assistant:

static int pager_shared_lock(Pager *pPager)
{
	int rc = UNQLITE_OK;
	if( pPager->iState == PAGER_OPEN ){
		unqlite_kv_methods *pMethods;
		/* Open the target database */
		rc = unqliteOsOpen(pPager->pVfs,pPager->pAllocator,pPager->zFilename,&pPager->pfd,pPager->iOpenFlags);
		if( rc != UNQLITE_OK ){
			unqliteGenErrorFormat(pPager->pDb,
				"IO error while opening the target database file: %s",pPager->zFilename
				);
			return rc;
		}
		/* Try to obtain a shared lock */
		rc = pager_wait_on_lock(pPager,SHARED_LOCK);
		if( rc == UNQLITE_OK ){
			if( pPager->iLock <= SHARED_LOCK ){
				/* Rollback any hot journal */
				rc = pager_journal_rollback(pPager,1);
				if( rc != UNQLITE_OK ){
					return rc;
				}
			}
			/* Read the database header */
			rc = pager_read_db_header(pPager);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			if(pPager->dbSize > 0 ){
				if( pPager->iOpenFlags & UNQLITE_OPEN_MMAP ){
					const jx9_vfs *pVfs = jx9ExportBuiltinVfs();
					/* Obtain a read-only memory view of the whole file */
					if( pVfs && pVfs->xMmap ){
						int vr;
						vr = pVfs->xMmap(pPager->zFilename,&pPager->pMmap,&pPager->dbByteSize);
						if( vr != JX9_OK ){
							/* Generate a warning */
							unqliteGenError(pPager->pDb,"Cannot obtain a read-only memory view of the target database");
							pPager->iOpenFlags &= ~UNQLITE_OPEN_MMAP;
						}
					}else{
						/* Generate a warning */
						unqliteGenError(pPager->pDb,"Cannot obtain a read-only memory view of the target database");
						pPager->iOpenFlags &= ~UNQLITE_OPEN_MMAP;
					}
				}
			}
			/* Update the pager state */
			pPager->iState = PAGER_READER;
			/* Invoke the xOpen methods if available */
			pMethods = pPager->pEngine->pIo->pMethods;
			if( pMethods->xOpen ){
				rc = pMethods->xOpen(pPager->pEngine,pPager->dbSize);
				if( rc != UNQLITE_OK ){
					unqliteGenErrorFormat(pPager->pDb,
						"xOpen() method of the underlying KV engine '%z' failed",
						&pPager->sKv
						);
					pager_unlock_db(pPager,NO_LOCK);
					pPager->iState = PAGER_OPEN;
					return rc;
				}
			}
		}else if( rc == UNQLITE_BUSY ){
			unqliteGenError(pPager->pDb,"Another process or thread have a reserved or exclusive lock on this database");
		}		
	}
	return rc;
}